

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<false> *key,ScriptFunction **value)

{
  Type *pTVar1;
  char *addr;
  SimpleDictionaryEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
  *pSVar2;
  uint uVar3;
  ScriptFunction *pSVar4;
  char16_t *pcVar5;
  int *piVar6;
  SimpleDictionaryEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
  *pSVar7;
  code *pcVar8;
  char cVar9;
  undefined8 uVar10;
  KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
  *pKVar11;
  hash_t hVar12;
  BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar13;
  int iVar14;
  undefined4 *puVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  CharacterBuffer<char16_t> *addr_00;
  ScriptFunction *local_68;
  SimpleDictionaryEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
  *local_60;
  BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_58;
  hash_t *local_50;
  ScriptFunction *local_48;
  hash_t local_3c;
  ScriptFunction **local_38;
  
  lVar16 = *(long *)this;
  local_38 = value;
  if (lVar16 == 0) {
    BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar16 = *(long *)this;
  }
  uVar17 = key->hash >> 1;
  local_50 = (hash_t *)CONCAT44(local_50._4_4_,uVar17);
  local_3c = PrimePolicy::ModPrime(uVar17,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar17 = *(uint *)(lVar16 + (ulong)local_3c * 4);
  local_58 = (BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar17 < 0) {
    cVar9 = (char)(uVar17 >> 0x18);
    uVar18 = 0;
  }
  else {
    lVar16 = *(long *)(this + 8);
    uVar18 = 0;
    do {
      addr = (char *)(lVar16 + (ulong)uVar17 * 0x38);
      bVar13 = Js::EvalMapStringInternal<false>::operator==
                         ((EvalMapStringInternal<false> *)(lVar16 + (ulong)uVar17 * 0x38 + 0x10),key
                         );
      if (bVar13) {
        if (local_58->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_58->stats,uVar18);
        }
        pSVar4 = *local_38;
        Memory::Recycler::WBSetBit((char *)&local_68);
        local_68 = pSVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
        pSVar4 = local_68;
        Memory::Recycler::WBSetBit(addr);
        *(ScriptFunction **)addr = pSVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        return uVar17;
      }
      uVar18 = uVar18 + 1;
      uVar17 = *(uint *)(addr + 8);
    } while (-1 < (int)uVar17);
    cVar9 = (char)(uVar17 >> 0x18);
  }
  this_00 = local_58;
  if (local_58->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_58->stats,uVar18);
  }
  if (cVar9 < '\0') {
    if (this_00->freeCount == 0) {
      uVar17 = this_00->count;
      if (uVar17 == this_00->size) {
        BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize(this_00);
        local_3c = PrimePolicy::ModPrime
                             ((hash_t)local_50,this_00->bucketCount,this_00->modFunctionIndex);
        uVar17 = this_00->count;
      }
      this_00->count = uVar17 + 1;
      if (this_00->size < (int)(uVar17 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f1,"(count <= size)","count <= size");
        if (!bVar13) goto LAB_007a6350;
        *puVar15 = 0;
      }
      if (this_00->size <= (int)uVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f2,"(index < size)","index < size");
        if (!bVar13) goto LAB_007a6350;
        *puVar15 = 0;
      }
    }
    else {
      if (this_00->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar13) goto LAB_007a6350;
        *puVar15 = 0;
      }
      if (this_00->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar13) goto LAB_007a6350;
        *puVar15 = 0;
      }
      if (this_00->count <= this_00->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar13 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar13) {
LAB_007a6350:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        *puVar15 = 0;
      }
      uVar17 = this_00->freeList;
      pTVar1 = &this_00->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar14 = BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((this_00->entries).ptr + (int)uVar17);
        this_00->freeList = iVar14;
      }
    }
    local_50 = &key->hash;
    local_60 = (this_00->entries).ptr;
    lVar16 = (long)(int)uVar17;
    pSVar7 = local_60 + lVar16;
    local_48 = *local_38;
    local_38 = (ScriptFunction **)lVar16;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = local_48;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    local_48 = local_68;
    Memory::Recycler::WBSetBit((char *)pSVar7);
    pSVar2 = local_60 + lVar16;
    addr_00 = &(pSVar2->
               super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               ).
               super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
               .
               super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
               .key.str;
    (pSVar2->
    super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    ).
    super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    .
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .value.ptr = local_48;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar7);
    (pSVar2->
    super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    ).
    super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    .
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .key.owningVar = key->owningVar;
    pcVar5 = (key->str).string.ptr;
    Memory::Recycler::WBSetBit((char *)addr_00);
    (addr_00->string).ptr = pcVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    (pSVar2->
    super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    ).
    super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    .
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .key.str.len = (key->str).len;
    hVar12 = local_50[1];
    uVar10 = *(undefined8 *)(local_50 + 2);
    pKVar11 = &(pSVar2->
               super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               ).
               super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    ;
    (pKVar11->
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    ).
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .key.hash = local_50[0];
    (pKVar11->
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    ).
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .key.moduleID = hVar12;
    *(undefined8 *)
     &(pSVar2->
      super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).
      super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
      .key.strict = uVar10;
    piVar6 = (local_58->buckets).ptr;
    pSVar7 = (local_58->entries).ptr;
    pSVar7[lVar16].
    super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .
    super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
    .
    super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
    .next = piVar6[local_3c];
    piVar6[local_3c] = (int)local_38;
    uVar18 = 0;
    uVar3 = uVar17;
    do {
      uVar3 = pSVar7[(int)uVar3].
              super_DefaultHashedEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .
              super_KeyValueEntry<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptFunction>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>_>
              .
              super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<false>,_Memory::WriteBarrierPtr<Js::ScriptFunction>_>
              .next;
      uVar18 = uVar18 + 1;
    } while (uVar3 != 0xffffffff);
    if (local_58->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(local_58->stats,uVar18);
    }
  }
  return uVar17;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }